

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RegistrarForTagAliases::RegistrarForTagAliases
          (RegistrarForTagAliases *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar1;
  IMutableRegistryHub *pIVar2;
  allocator local_62;
  allocator local_61;
  string local_60 [32];
  string local_40 [32];
  
  pSVar1 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  std::__cxx11::string::string(local_40,alias,&local_61);
  std::__cxx11::string::string(local_60,tag,&local_62);
  pIVar2 = &(pSVar1->super_RegistryHub).super_IMutableRegistryHub;
  (*pIVar2->_vptr_IMutableRegistryHub[6])(pIVar2,local_40,local_60,lineInfo);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

RegistrarForTagAliases::RegistrarForTagAliases(char const* alias, char const* tag, SourceLineInfo const& lineInfo) {
        CATCH_TRY {
            getMutableRegistryHub().registerTagAlias(alias, tag, lineInfo);
        }